

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiArea::setActiveSubWindow(QMdiArea *this,QMdiSubWindow *window)

{
  QMdiAreaPrivate *this_00;
  long lVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  long lVar4;
  QMdiSubWindow *pQVar5;
  
  this_00 = *(QMdiAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if (window != (QMdiSubWindow *)0x0) {
    lVar1 = (this_00->childWindows).d.size;
    if (lVar1 == 0) {
      setActiveSubWindow();
    }
    else {
      pQVar2 = (this_00->childWindows).d.ptr;
      lVar4 = 0;
      do {
        if (lVar1 << 4 == lVar4) goto LAB_004422fc;
        lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar4);
        if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
          pQVar5 = (QMdiSubWindow *)0x0;
        }
        else {
          pQVar5 = *(QMdiSubWindow **)((long)&(pQVar2->wp).value + lVar4);
        }
        lVar4 = lVar4 + 0x10;
      } while (pQVar5 != window);
      if (lVar4 != 0) goto LAB_00442305;
LAB_004422fc:
      setActiveSubWindow();
    }
    return;
  }
  window = (QMdiSubWindow *)0x0;
LAB_00442305:
  QMdiAreaPrivate::activateWindow(this_00,window);
  return;
}

Assistant:

void QMdiArea::setActiveSubWindow(QMdiSubWindow *window)
{
    Q_D(QMdiArea);
    if (!window) {
        d->activateWindow(nullptr);
        return;
    }

    if (Q_UNLIKELY(d->childWindows.isEmpty())) {
        qWarning("QMdiArea::setActiveSubWindow: workspace is empty");
        return;
    }

    if (Q_UNLIKELY(d->childWindows.indexOf(window) == -1)) {
        qWarning("QMdiArea::setActiveSubWindow: window is not inside workspace");
        return;
    }

    d->activateWindow(window);
}